

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Arg.h
# Opt level: O1

void __thiscall TCLAP::Arg::~Arg(Arg *this)

{
  pointer pcVar1;
  
  this->_vptr_Arg = (_func_int **)&PTR__Arg_0013a6a0;
  pcVar1 = (this->_requireLabel)._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != &(this->_requireLabel).field_2) {
    operator_delete(pcVar1);
  }
  pcVar1 = (this->_description)._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != &(this->_description).field_2) {
    operator_delete(pcVar1);
  }
  pcVar1 = (this->_name)._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != &(this->_name).field_2) {
    operator_delete(pcVar1);
  }
  pcVar1 = (this->_flag)._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != &(this->_flag).field_2) {
    operator_delete(pcVar1);
    return;
  }
  return;
}

Assistant:

inline Arg::~Arg() { }